

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stored.c
# Opt level: O0

block_state deflate_stored(deflate_state *s,int flush)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int in_ESI;
  long *in_RDI;
  bool bVar4;
  uint used;
  uint last;
  uint have;
  uint left;
  uint len;
  uint min_block;
  uint in_stack_ffffffffffffff98;
  uint uVar5;
  undefined2 in_stack_ffffffffffffff9c;
  uint16_t in_stack_ffffffffffffff9e;
  undefined4 in_stack_ffffffffffffffa0;
  uint uVar6;
  undefined4 in_stack_ffffffffffffffa4;
  uint uVar7;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar9;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 local_48;
  uint local_44;
  undefined4 local_40;
  uint local_3c;
  uint local_34;
  uint local_30;
  uint local_24;
  uint local_1c;
  block_state local_4;
  
  if (*(uint *)(in_RDI + 8) < (int)in_RDI[3] - 5U) {
    local_30 = *(uint *)(in_RDI + 8);
  }
  else {
    local_30 = (int)in_RDI[3] - 5;
  }
  bVar4 = false;
  iVar2 = *(int *)(*in_RDI + 8);
  while( true ) {
    local_1c = 0xffff;
    local_34 = (int)in_RDI[0x2f0] + 0x2a >> 3;
    if (*(uint *)(*in_RDI + 0x20) < local_34) break;
    local_34 = *(int *)(*in_RDI + 0x20) - local_34;
    local_3c = *(int *)((long)in_RDI + 0x84) - *(int *)((long)in_RDI + 0x74);
    if ((ulong)local_3c + (ulong)*(uint *)(*in_RDI + 8) < 0xffff) {
      local_1c = local_3c + *(int *)(*in_RDI + 8);
    }
    if (local_1c <= local_34) {
      local_34 = local_1c;
    }
    local_1c = local_34;
    if ((local_34 < local_30) &&
       ((((local_34 == 0 && (in_ESI != 4)) || (in_ESI == 0)) ||
        (local_34 != local_3c + *(int *)(*in_RDI + 8))))) break;
    bVar4 = false;
    if (in_ESI == 4) {
      bVar4 = local_34 == local_3c + *(int *)(*in_RDI + 8);
    }
    zng_tr_stored_block((deflate_state *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        (char *)CONCAT26(in_stack_ffffffffffffff9e,
                                         CONCAT24(in_stack_ffffffffffffff9c,
                                                  in_stack_ffffffffffffff98)),0,0x10d7da);
    *(int *)((long)in_RDI + 0x1c) = *(int *)((long)in_RDI + 0x1c) + -4;
    put_short((deflate_state *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
              in_stack_ffffffffffffff9e);
    put_short((deflate_state *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
              in_stack_ffffffffffffff9e);
    zng_flush_pending((zng_stream *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    if (local_3c != 0) {
      if (local_34 < local_3c) {
        local_3c = local_34;
      }
      memcpy(*(void **)(*in_RDI + 0x18),(void *)(in_RDI[0xb] + (long)*(int *)((long)in_RDI + 0x74)),
             (ulong)local_3c);
      *(ulong *)(*in_RDI + 0x18) = *(long *)(*in_RDI + 0x18) + (ulong)local_3c;
      *(uint *)(*in_RDI + 0x20) = *(int *)(*in_RDI + 0x20) - local_3c;
      *(ulong *)(*in_RDI + 0x28) = (ulong)local_3c + *(long *)(*in_RDI + 0x28);
      *(uint *)((long)in_RDI + 0x74) = local_3c + *(int *)((long)in_RDI + 0x74);
      local_1c = local_34 - local_3c;
    }
    if (local_1c != 0) {
      zng_read_buf((zng_stream *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                   (uchar *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   CONCAT22(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff9c));
      *(ulong *)(*in_RDI + 0x18) = *(long *)(*in_RDI + 0x18) + (ulong)local_1c;
      *(uint *)(*in_RDI + 0x20) = *(int *)(*in_RDI + 0x20) - local_1c;
      *(ulong *)(*in_RDI + 0x28) = (ulong)local_1c + *(long *)(*in_RDI + 0x28);
    }
    if (bVar4) break;
  }
  local_44 = iVar2 - *(int *)(*in_RDI + 8);
  if (local_44 != 0) {
    if (local_44 < *(uint *)(in_RDI + 8)) {
      if ((uint)(*(int *)((long)in_RDI + 0x54) - *(int *)((long)in_RDI + 0x84)) <= local_44) {
        *(int *)((long)in_RDI + 0x84) = *(int *)((long)in_RDI + 0x84) - (int)in_RDI[8];
        memcpy((void *)in_RDI[0xb],(void *)(in_RDI[0xb] + (ulong)*(uint *)(in_RDI + 8)),
               (ulong)*(uint *)((long)in_RDI + 0x84));
        if (*(uint *)(in_RDI + 0x2eb) < 2) {
          *(int *)(in_RDI + 0x2eb) = (int)in_RDI[0x2eb] + 1;
        }
        if (*(uint *)((long)in_RDI + 0x84) < *(uint *)((long)in_RDI + 0x175c)) {
          local_40 = *(undefined4 *)((long)in_RDI + 0x84);
        }
        else {
          local_40 = *(undefined4 *)((long)in_RDI + 0x175c);
        }
        *(undefined4 *)((long)in_RDI + 0x175c) = local_40;
      }
      memcpy((void *)(in_RDI[0xb] + (ulong)*(uint *)((long)in_RDI + 0x84)),
             (void *)(*(long *)*in_RDI - (ulong)local_44),(ulong)local_44);
      *(uint *)((long)in_RDI + 0x84) = local_44 + *(int *)((long)in_RDI + 0x84);
      if ((uint)((int)in_RDI[8] - *(int *)((long)in_RDI + 0x175c)) < local_44) {
        local_44 = (int)in_RDI[8] - *(int *)((long)in_RDI + 0x175c);
      }
      *(uint *)((long)in_RDI + 0x175c) = local_44 + *(int *)((long)in_RDI + 0x175c);
    }
    else {
      *(undefined4 *)(in_RDI + 0x2eb) = 2;
      memcpy((void *)in_RDI[0xb],(void *)(*(long *)*in_RDI - (ulong)*(uint *)(in_RDI + 8)),
             (ulong)*(uint *)(in_RDI + 8));
      *(int *)((long)in_RDI + 0x84) = (int)in_RDI[8];
      *(undefined4 *)((long)in_RDI + 0x175c) = *(undefined4 *)((long)in_RDI + 0x84);
    }
    *(undefined4 *)((long)in_RDI + 0x74) = *(undefined4 *)((long)in_RDI + 0x84);
  }
  if (*(uint *)(in_RDI + 10) < *(uint *)((long)in_RDI + 0x84)) {
    local_48 = *(undefined4 *)((long)in_RDI + 0x84);
  }
  else {
    local_48 = (undefined4)in_RDI[10];
  }
  *(undefined4 *)(in_RDI + 10) = local_48;
  if (bVar4) {
    local_4 = finish_done;
  }
  else if (((in_ESI == 0) || (in_ESI == 4)) ||
          ((*(int *)(*in_RDI + 8) != 0 ||
           (*(int *)((long)in_RDI + 0x84) != *(int *)((long)in_RDI + 0x74))))) {
    local_24 = *(int *)((long)in_RDI + 0x54) - *(int *)((long)in_RDI + 0x84);
    if ((local_24 < *(uint *)(*in_RDI + 8)) && ((int)in_RDI[8] <= *(int *)((long)in_RDI + 0x74))) {
      *(int *)((long)in_RDI + 0x74) = *(int *)((long)in_RDI + 0x74) - (int)in_RDI[8];
      *(int *)((long)in_RDI + 0x84) = *(int *)((long)in_RDI + 0x84) - (int)in_RDI[8];
      memcpy((void *)in_RDI[0xb],(void *)(in_RDI[0xb] + (ulong)*(uint *)(in_RDI + 8)),
             (ulong)*(uint *)((long)in_RDI + 0x84));
      if (*(uint *)(in_RDI + 0x2eb) < 2) {
        *(int *)(in_RDI + 0x2eb) = (int)in_RDI[0x2eb] + 1;
      }
      local_24 = (int)in_RDI[8] + local_24;
      if (*(uint *)((long)in_RDI + 0x84) < *(uint *)((long)in_RDI + 0x175c)) {
        in_stack_ffffffffffffffb4 = *(undefined4 *)((long)in_RDI + 0x84);
      }
      else {
        in_stack_ffffffffffffffb4 = *(undefined4 *)((long)in_RDI + 0x175c);
      }
      *(undefined4 *)((long)in_RDI + 0x175c) = in_stack_ffffffffffffffb4;
    }
    if (*(uint *)(*in_RDI + 8) < local_24) {
      local_24 = *(uint *)(*in_RDI + 8);
    }
    uVar9 = local_24;
    if (local_24 != 0) {
      zng_read_buf((zng_stream *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                   (uchar *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   CONCAT22(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff9c));
      *(uint *)((long)in_RDI + 0x84) = local_24 + *(int *)((long)in_RDI + 0x84);
      if ((uint)((int)in_RDI[8] - *(int *)((long)in_RDI + 0x175c)) < local_24) {
        local_24 = (int)in_RDI[8] - *(int *)((long)in_RDI + 0x175c);
      }
      *(uint *)((long)in_RDI + 0x175c) = local_24 + *(int *)((long)in_RDI + 0x175c);
    }
    if (*(uint *)(in_RDI + 10) < *(uint *)((long)in_RDI + 0x84)) {
      uVar8 = *(undefined4 *)((long)in_RDI + 0x84);
    }
    else {
      uVar8 = (undefined4)in_RDI[10];
    }
    *(undefined4 *)(in_RDI + 10) = uVar8;
    iVar2 = (int)in_RDI[0x2f0] + 0x2a >> 3;
    if ((uint)((int)in_RDI[3] - iVar2) < 0x10000) {
      uVar7 = (int)in_RDI[3] - iVar2;
    }
    else {
      uVar7 = 0xffff;
    }
    uVar6 = uVar7;
    if (*(uint *)(in_RDI + 8) < uVar7) {
      uVar6 = *(uint *)(in_RDI + 8);
    }
    uVar3 = *(int *)((long)in_RDI + 0x84) - *(int *)((long)in_RDI + 0x74);
    if ((uVar6 <= uVar3) ||
       ((((uVar3 != 0 || (in_ESI == 4)) && (in_ESI != 0)) &&
        ((*(int *)(*in_RDI + 8) == 0 && (uVar3 <= uVar7)))))) {
      uVar1 = uVar3;
      if (uVar7 < uVar3) {
        uVar1 = uVar7;
      }
      uVar5 = in_stack_ffffffffffffff98 & 0xffffff;
      if ((in_ESI == 4) &&
         (uVar5 = in_stack_ffffffffffffff98 & 0xffffff, *(int *)(*in_RDI + 8) == 0)) {
        uVar5 = CONCAT13(uVar1 == uVar3,(int3)in_stack_ffffffffffffff98);
      }
      bVar4 = (char)(uVar5 >> 0x18) != '\0';
      zng_tr_stored_block((deflate_state *)CONCAT44(uVar7,uVar6),
                          (char *)CONCAT26((short)(uVar1 >> 0x10),CONCAT24((short)uVar1,uVar5)),0,
                          0x10df85);
      *(uint *)((long)in_RDI + 0x74) = uVar1 + *(int *)((long)in_RDI + 0x74);
      zng_flush_pending((zng_stream *)CONCAT44(in_stack_ffffffffffffffb4,uVar9));
    }
    local_4 = need_more;
    if (bVar4) {
      local_4 = finish_started;
    }
  }
  else {
    local_4 = block_done;
  }
  return local_4;
}

Assistant:

Z_INTERNAL block_state deflate_stored(deflate_state *s, int flush) {
    /* Smallest worthy block size when not flushing or finishing. By default
     * this is 32K. This can be as small as 507 bytes for memLevel == 1. For
     * large input and output buffers, the stored block size will be larger.
     */
    unsigned min_block = MIN(s->pending_buf_size - 5, s->w_size);

    /* Copy as many min_block or larger stored blocks directly to next_out as
     * possible. If flushing, copy the remaining available input to next_out as
     * stored blocks, if there is enough space.
     */
    unsigned len, left, have, last = 0;
    unsigned used = s->strm->avail_in;
    do {
        /* Set len to the maximum size block that we can copy directly with the
         * available input data and output space. Set left to how much of that
         * would be copied from what's left in the window.
         */
        len = MAX_STORED;       /* maximum deflate stored block length */
        have = (s->bi_valid + 42) >> 3;         /* number of header bytes */
        if (s->strm->avail_out < have)          /* need room for header */
            break;
            /* maximum stored block length that will fit in avail_out: */
        have = s->strm->avail_out - have;
        left = (int)s->strstart - s->block_start;    /* bytes left in window */
        if (len > (unsigned long)left + s->strm->avail_in)
            len = left + s->strm->avail_in;     /* limit len to the input */
        len = MIN(len, have);                   /* limit len to the output */

        /* If the stored block would be less than min_block in length, or if
         * unable to copy all of the available input when flushing, then try
         * copying to the window and the pending buffer instead. Also don't
         * write an empty block when flushing -- deflate() does that.
         */
        if (len < min_block && ((len == 0 && flush != Z_FINISH) || flush == Z_NO_FLUSH || len != left + s->strm->avail_in))
            break;

        /* Make a dummy stored block in pending to get the header bytes,
         * including any pending bits. This also updates the debugging counts.
         */
        last = flush == Z_FINISH && len == left + s->strm->avail_in ? 1 : 0;
        zng_tr_stored_block(s, (char *)0, 0L, last);

        /* Replace the lengths in the dummy stored block with len. */
        s->pending -= 4;
        put_short(s, (uint16_t)len);
        put_short(s, (uint16_t)~len);

        /* Write the stored block header bytes. */
        PREFIX(flush_pending)(s->strm);

        /* Update debugging counts for the data about to be copied. */
        cmpr_bits_add(s, len << 3);
        sent_bits_add(s, len << 3);

        /* Copy uncompressed bytes from the window to next_out. */
        if (left) {
            left = MIN(left, len);
            memcpy(s->strm->next_out, s->window + s->block_start, left);
            s->strm->next_out += left;
            s->strm->avail_out -= left;
            s->strm->total_out += left;
            s->block_start += (int)left;
            len -= left;
        }

        /* Copy uncompressed bytes directly from next_in to next_out, updating
         * the check value.
         */
        if (len) {
            PREFIX(read_buf)(s->strm, s->strm->next_out, len);
            s->strm->next_out += len;
            s->strm->avail_out -= len;
            s->strm->total_out += len;
        }
    } while (last == 0);

    /* Update the sliding window with the last s->w_size bytes of the copied
     * data, or append all of the copied data to the existing window if less
     * than s->w_size bytes were copied. Also update the number of bytes to
     * insert in the hash tables, in the event that deflateParams() switches to
     * a non-zero compression level.
     */
    used -= s->strm->avail_in;      /* number of input bytes directly copied */
    if (used) {
        /* If any input was used, then no unused input remains in the window,
         * therefore s->block_start == s->strstart.
         */
        if (used >= s->w_size) {    /* supplant the previous history */
            s->matches = 2;         /* clear hash */
            memcpy(s->window, s->strm->next_in - s->w_size, s->w_size);
            s->strstart = s->w_size;
            s->insert = s->strstart;
        } else {
            if (s->window_size - s->strstart <= used) {
                /* Slide the window down. */
                s->strstart -= s->w_size;
                memcpy(s->window, s->window + s->w_size, s->strstart);
                if (s->matches < 2)
                    s->matches++;   /* add a pending slide_hash() */
                s->insert = MIN(s->insert, s->strstart);
            }
            memcpy(s->window + s->strstart, s->strm->next_in - used, used);
            s->strstart += used;
            s->insert += MIN(used, s->w_size - s->insert);
        }
        s->block_start = (int)s->strstart;
    }
    s->high_water = MAX(s->high_water, s->strstart);

    /* If the last block was written to next_out, then done. */
    if (last)
        return finish_done;

    /* If flushing and all input has been consumed, then done. */
    if (flush != Z_NO_FLUSH && flush != Z_FINISH && s->strm->avail_in == 0 && (int)s->strstart == s->block_start)
        return block_done;

    /* Fill the window with any remaining input. */
    have = s->window_size - s->strstart;
    if (s->strm->avail_in > have && s->block_start >= (int)s->w_size) {
        /* Slide the window down. */
        s->block_start -= (int)s->w_size;
        s->strstart -= s->w_size;
        memcpy(s->window, s->window + s->w_size, s->strstart);
        if (s->matches < 2)
            s->matches++;           /* add a pending slide_hash() */
        have += s->w_size;          /* more space now */
        s->insert = MIN(s->insert, s->strstart);
    }

    have = MIN(have, s->strm->avail_in);
    if (have) {
        PREFIX(read_buf)(s->strm, s->window + s->strstart, have);
        s->strstart += have;
        s->insert += MIN(have, s->w_size - s->insert);
    }
    s->high_water = MAX(s->high_water, s->strstart);

    /* There was not enough avail_out to write a complete worthy or flushed
     * stored block to next_out. Write a stored block to pending instead, if we
     * have enough input for a worthy block, or if flushing and there is enough
     * room for the remaining input as a stored block in the pending buffer.
     */
    have = (s->bi_valid + 42) >> 3;         /* number of header bytes */
        /* maximum stored block length that will fit in pending: */
    have = MIN(s->pending_buf_size - have, MAX_STORED);
    min_block = MIN(have, s->w_size);
    left = (int)s->strstart - s->block_start;
    if (left >= min_block || ((left || flush == Z_FINISH) && flush != Z_NO_FLUSH && s->strm->avail_in == 0 && left <= have)) {
        len = MIN(left, have);
        last = flush == Z_FINISH && s->strm->avail_in == 0 && len == left ? 1 : 0;
        zng_tr_stored_block(s, (char *)s->window + s->block_start, len, last);
        s->block_start += (int)len;
        PREFIX(flush_pending)(s->strm);
    }

    /* We've done all we can with the available input and output. */
    return last ? finish_started : need_more;
}